

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrs.cpp
# Opt level: O0

UBool __thiscall icu_63::NFRuleSet::operator==(NFRuleSet *this,NFRuleSet *rhs)

{
  UBool UVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  NFRule *this_00;
  NFRule *rhs_00;
  uint local_28;
  int local_24;
  uint32_t i_1;
  int i;
  NFRuleSet *rhs_local;
  NFRuleSet *this_local;
  
  uVar2 = NFRuleList::size(&this->rules);
  uVar3 = NFRuleList::size(&rhs->rules);
  if (((uVar2 == uVar3) && (this->fIsFractionRuleSet == rhs->fIsFractionRuleSet)) &&
     (UVar1 = UnicodeString::operator==(&this->name,&rhs->name), UVar1 != '\0')) {
    for (local_24 = 0; local_24 < 6; local_24 = local_24 + 1) {
      UVar1 = util_equalRules(this->nonNumericalRules[local_24],rhs->nonNumericalRules[local_24]);
      if (UVar1 == '\0') {
        return '\0';
      }
    }
    local_28 = 0;
    while( true ) {
      uVar2 = NFRuleList::size(&this->rules);
      if (uVar2 <= local_28) {
        return '\x01';
      }
      this_00 = NFRuleList::operator[](&this->rules,local_28);
      rhs_00 = NFRuleList::operator[](&rhs->rules,local_28);
      UVar1 = NFRule::operator!=(this_00,rhs_00);
      if (UVar1 != '\0') break;
      local_28 = local_28 + 1;
    }
    return '\0';
  }
  return '\0';
}

Assistant:

UBool
NFRuleSet::operator==(const NFRuleSet& rhs) const
{
    if (rules.size() == rhs.rules.size() &&
        fIsFractionRuleSet == rhs.fIsFractionRuleSet &&
        name == rhs.name) {

        // ...then compare the non-numerical rule lists...
        for (int i = 0; i < NON_NUMERICAL_RULE_LENGTH; i++) {
            if (!util_equalRules(nonNumericalRules[i], rhs.nonNumericalRules[i])) {
                return FALSE;
            }
        }

        // ...then compare the rule lists...
        for (uint32_t i = 0; i < rules.size(); ++i) {
            if (*rules[i] != *rhs.rules[i]) {
                return FALSE;
            }
        }
        return TRUE;
    }
    return FALSE;
}